

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O0

int Acec_MatchBoxes(Acec_Box_t *pBox0,Acec_Box_t *pBox1)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Vec_Int_t *pVVar8;
  Vec_Wec_t *pVVar9;
  Vec_Int_t *pVVar10;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  int *piVar11;
  int *piVar12;
  int *piVar13;
  int Entry1;
  int Entry0;
  int *pEnd1;
  int *pEnd0;
  int *pBeg1;
  int *pBeg0;
  Vec_Int_t *vLevel1;
  Vec_Int_t *vLevel0;
  Vec_Int_t *vUnique1;
  Vec_Int_t *vUnique0;
  Vec_Int_t *vShared1;
  Vec_Int_t *vShared0;
  int nTotal;
  int nSize;
  int i;
  Vec_Int_t *vLevel;
  Vec_Int_t *vMap1;
  Vec_Int_t *vMap0;
  Acec_Box_t *pBox1_local;
  Acec_Box_t *pBox0_local;
  
  vMap0 = (Vec_Int_t *)pBox1;
  pBox1_local = pBox0;
  Acec_ComputeEquivClasses(pBox0->pGia,pBox1->pGia,&vMap1,&vLevel);
  for (nTotal = 0; iVar2 = Vec_WecSize(pBox1_local->vLeafLits), nTotal < iVar2; nTotal = nTotal + 1)
  {
    pVVar8 = Vec_WecEntry(pBox1_local->vLeafLits,nTotal);
    piVar11 = Vec_IntArray(pVVar8);
    iVar2 = Vec_IntSize(pVVar8);
    piVar12 = Vec_IntArray(vMap1);
    Acec_MatchBoxesSort(piVar11,iVar2,piVar12);
  }
  for (nTotal = 0; iVar2 = Vec_WecSize(*(Vec_Wec_t **)(vMap0 + 1)), nTotal < iVar2;
      nTotal = nTotal + 1) {
    pVVar8 = Vec_WecEntry(*(Vec_Wec_t **)(vMap0 + 1),nTotal);
    piVar11 = Vec_IntArray(pVVar8);
    iVar2 = Vec_IntSize(pVVar8);
    piVar12 = Vec_IntArray(vLevel);
    Acec_MatchBoxesSort(piVar11,iVar2,piVar12);
  }
  Acec_MatchCheckShift
            (pBox1_local->pGia,*(Gia_Man_t **)vMap0,pBox1_local->vLeafLits,
             *(Vec_Wec_t **)(vMap0 + 1),vMap1,vLevel,pBox1_local->vRootLits,
             (Vec_Wec_t *)vMap0[1].pArray);
  if (pBox1_local->vShared != (Vec_Wec_t *)0x0) {
    __assert_fail("pBox0->vShared == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCore.c"
                  ,0x19e,"int Acec_MatchBoxes(Acec_Box_t *, Acec_Box_t *)");
  }
  lVar1._0_4_ = vMap0[2].nCap;
  lVar1._4_4_ = vMap0[2].nSize;
  if (lVar1 != 0) {
    __assert_fail("pBox1->vShared == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCore.c"
                  ,0x19f,"int Acec_MatchBoxes(Acec_Box_t *, Acec_Box_t *)");
  }
  iVar2 = Vec_WecSize(pBox1_local->vLeafLits);
  pVVar9 = Vec_WecStart(iVar2);
  pBox1_local->vShared = pVVar9;
  iVar2 = Vec_WecSize(*(Vec_Wec_t **)(vMap0 + 1));
  pVVar9 = Vec_WecStart(iVar2);
  *(Vec_Wec_t **)(vMap0 + 2) = pVVar9;
  iVar2 = Vec_WecSize(pBox1_local->vLeafLits);
  pVVar9 = Vec_WecStart(iVar2);
  pBox1_local->vUnique = pVVar9;
  iVar2 = Vec_WecSize(*(Vec_Wec_t **)(vMap0 + 1));
  pVVar9 = Vec_WecStart(iVar2);
  vMap0[2].pArray = &pVVar9->nCap;
  iVar2 = Vec_WecSize(pBox1_local->vLeafLits);
  iVar3 = Vec_WecSize(*(Vec_Wec_t **)(vMap0 + 1));
  iVar2 = Abc_MinInt(iVar2,iVar3);
  for (nTotal = iVar2; iVar4 = Vec_WecSize(pBox1_local->vLeafLits), iVar3 = iVar2, nTotal < iVar4;
      nTotal = nTotal + 1) {
    pVVar8 = Vec_WecEntry(pBox1_local->vLeafLits,nTotal);
    pVVar10 = Vec_WecEntry(pBox1_local->vUnique,nTotal);
    Vec_IntAppend(pVVar10,pVVar8);
  }
  while (nTotal = iVar3, iVar3 = Vec_WecSize(*(Vec_Wec_t **)(vMap0 + 1)), nTotal < iVar3) {
    pVVar8 = Vec_WecEntry(*(Vec_Wec_t **)(vMap0 + 1),nTotal);
    pVVar10 = Vec_WecEntry((Vec_Wec_t *)vMap0[2].pArray,nTotal);
    Vec_IntAppend(pVVar10,pVVar8);
    iVar3 = nTotal + 1;
  }
  nTotal = 0;
  while( true ) {
    if (iVar2 <= nTotal) {
      uVar6 = Vec_WecSizeSize(pBox1_local->vShared);
      uVar7 = Vec_WecSizeSize(pBox1_local->vLeafLits);
      printf("Box0: Matched %d entries out of %d.\n",(ulong)uVar6,(ulong)uVar7);
      uVar7 = Vec_WecSizeSize(*(Vec_Wec_t **)(vMap0 + 1));
      printf("Box1: Matched %d entries out of %d.\n",(ulong)uVar6,(ulong)uVar7);
      Vec_IntFree(vMap1);
      Vec_IntFree(vLevel);
      return uVar6;
    }
    pVVar8 = Vec_WecEntry(pBox1_local->vShared,nTotal);
    pVVar10 = Vec_WecEntry(*(Vec_Wec_t **)(vMap0 + 2),nTotal);
    p = Vec_WecEntry(pBox1_local->vUnique,nTotal);
    p_00 = Vec_WecEntry((Vec_Wec_t *)vMap0[2].pArray,nTotal);
    p_01 = Vec_WecEntry(pBox1_local->vLeafLits,nTotal);
    p_02 = Vec_WecEntry(*(Vec_Wec_t **)(vMap0 + 1),nTotal);
    pBeg1 = Vec_IntArray(p_01);
    pEnd0 = Vec_IntArray(p_02);
    piVar11 = Vec_IntLimit(p_01);
    piVar12 = Vec_IntLimit(p_02);
    while (pBeg1 < piVar11 && pEnd0 < piVar12) {
      piVar13 = Vec_IntArray(vMap1);
      iVar3 = Abc_Lit2LitL(piVar13,*pBeg1);
      piVar13 = Vec_IntArray(vLevel);
      iVar4 = Abc_Lit2LitL(piVar13,*pEnd0);
      if ((*pBeg1 == 0) || (*pEnd0 == 0)) {
        __assert_fail("*pBeg0 && *pBeg1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCore.c"
                      ,0x1ba,"int Acec_MatchBoxes(Acec_Box_t *, Acec_Box_t *)");
      }
      if (iVar3 == iVar4) {
        Vec_IntPush(pVVar8,*pBeg1);
        Vec_IntPush(pVVar10,*pEnd0);
        pEnd0 = pEnd0 + 1;
        pBeg1 = pBeg1 + 1;
      }
      else if (iVar4 < iVar3) {
        Vec_IntPush(p,*pBeg1);
        pBeg1 = pBeg1 + 1;
      }
      else {
        Vec_IntPush(p_00,*pEnd0);
        pEnd0 = pEnd0 + 1;
      }
    }
    while (pBeg1 < piVar11) {
      Vec_IntPush(p,*pBeg1);
      pBeg1 = pBeg1 + 1;
    }
    while (pEnd0 < piVar12) {
      Vec_IntPush(p_00,*pEnd0);
      pEnd0 = pEnd0 + 1;
    }
    iVar3 = Vec_IntSize(pVVar8);
    iVar4 = Vec_IntSize(pVVar10);
    if (iVar3 != iVar4) break;
    iVar3 = Vec_IntSize(pVVar8);
    iVar4 = Vec_IntSize(p);
    iVar5 = Vec_IntSize(p_01);
    if (iVar3 + iVar4 != iVar5) {
      __assert_fail("Vec_IntSize(vShared0) + Vec_IntSize(vUnique0) == Vec_IntSize(vLevel0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCore.c"
                    ,0x1ca,"int Acec_MatchBoxes(Acec_Box_t *, Acec_Box_t *)");
    }
    iVar3 = Vec_IntSize(pVVar10);
    iVar4 = Vec_IntSize(p_00);
    iVar5 = Vec_IntSize(p_02);
    if (iVar3 + iVar4 != iVar5) {
      __assert_fail("Vec_IntSize(vShared1) + Vec_IntSize(vUnique1) == Vec_IntSize(vLevel1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCore.c"
                    ,0x1cb,"int Acec_MatchBoxes(Acec_Box_t *, Acec_Box_t *)");
    }
    nTotal = nTotal + 1;
  }
  __assert_fail("Vec_IntSize(vShared0) == Vec_IntSize(vShared1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCore.c"
                ,0x1c9,"int Acec_MatchBoxes(Acec_Box_t *, Acec_Box_t *)");
}

Assistant:

int Acec_MatchBoxes( Acec_Box_t * pBox0, Acec_Box_t * pBox1 )
{
    Vec_Int_t * vMap0, * vMap1, * vLevel; 
    int i, nSize, nTotal;
    Acec_ComputeEquivClasses( pBox0->pGia, pBox1->pGia, &vMap0, &vMap1 );
    // sort nodes in the classes by their equivalences
    Vec_WecForEachLevel( pBox0->vLeafLits, vLevel, i )
        Acec_MatchBoxesSort( Vec_IntArray(vLevel), Vec_IntSize(vLevel), Vec_IntArray(vMap0) );
    Vec_WecForEachLevel( pBox1->vLeafLits, vLevel, i )
        Acec_MatchBoxesSort( Vec_IntArray(vLevel), Vec_IntSize(vLevel), Vec_IntArray(vMap1) );
    Acec_MatchCheckShift( pBox0->pGia, pBox1->pGia, pBox0->vLeafLits, pBox1->vLeafLits, vMap0, vMap1, pBox0->vRootLits, pBox1->vRootLits );
    
    //Acec_MatchPrintEquivLits( pBox0->pGia, pBox0->vLeafLits, Vec_IntArray(vMap0), 0 );
    //Acec_MatchPrintEquivLits( pBox1->pGia, pBox1->vLeafLits, Vec_IntArray(vMap1), 0 );
    //printf( "Outputs:\n" );
    //Vec_WecPrintLits( pBox0->vRootLits );
    //printf( "Outputs:\n" );
    //Vec_WecPrintLits( pBox1->vRootLits );

    // reorder nodes to have the same order
    assert( pBox0->vShared == NULL );
    assert( pBox1->vShared == NULL );
    pBox0->vShared = Vec_WecStart( Vec_WecSize(pBox0->vLeafLits) );
    pBox1->vShared = Vec_WecStart( Vec_WecSize(pBox1->vLeafLits) );
    pBox0->vUnique = Vec_WecStart( Vec_WecSize(pBox0->vLeafLits) );
    pBox1->vUnique = Vec_WecStart( Vec_WecSize(pBox1->vLeafLits) );
    nSize = Abc_MinInt( Vec_WecSize(pBox0->vLeafLits), Vec_WecSize(pBox1->vLeafLits) );
    Vec_WecForEachLevelStart( pBox0->vLeafLits, vLevel, i, nSize )
        Vec_IntAppend( Vec_WecEntry(pBox0->vUnique, i), vLevel );
    Vec_WecForEachLevelStart( pBox1->vLeafLits, vLevel, i, nSize )
        Vec_IntAppend( Vec_WecEntry(pBox1->vUnique, i), vLevel );
    for ( i = 0; i < nSize; i++ )
    {
        Vec_Int_t * vShared0 = Vec_WecEntry( pBox0->vShared, i );
        Vec_Int_t * vShared1 = Vec_WecEntry( pBox1->vShared, i );
        Vec_Int_t * vUnique0 = Vec_WecEntry( pBox0->vUnique, i );
        Vec_Int_t * vUnique1 = Vec_WecEntry( pBox1->vUnique, i );

        Vec_Int_t * vLevel0 = Vec_WecEntry( pBox0->vLeafLits, i );
        Vec_Int_t * vLevel1 = Vec_WecEntry( pBox1->vLeafLits, i );
        int * pBeg0 = Vec_IntArray(vLevel0);
        int * pBeg1 = Vec_IntArray(vLevel1);
        int * pEnd0 = Vec_IntLimit(vLevel0);
        int * pEnd1 = Vec_IntLimit(vLevel1);
        while ( pBeg0 < pEnd0 && pBeg1 < pEnd1 )
        {
            int Entry0 = Abc_Lit2LitL( Vec_IntArray(vMap0), *pBeg0 );
            int Entry1 = Abc_Lit2LitL( Vec_IntArray(vMap1), *pBeg1 );
            assert( *pBeg0 && *pBeg1 );
            if ( Entry0 == Entry1 )
            {
                Vec_IntPush( vShared0, *pBeg0++ );
                Vec_IntPush( vShared1, *pBeg1++ );
            }
            else if ( Entry0 > Entry1 )
                Vec_IntPush( vUnique0, *pBeg0++ );
            else 
                Vec_IntPush( vUnique1, *pBeg1++ );
        }
        while ( pBeg0 < pEnd0 )
            Vec_IntPush( vUnique0, *pBeg0++ );
        while ( pBeg1 < pEnd1 )
            Vec_IntPush( vUnique1, *pBeg1++ );
        assert( Vec_IntSize(vShared0) == Vec_IntSize(vShared1) );
        assert( Vec_IntSize(vShared0) + Vec_IntSize(vUnique0) == Vec_IntSize(vLevel0) );
        assert( Vec_IntSize(vShared1) + Vec_IntSize(vUnique1) == Vec_IntSize(vLevel1) );
    }
    nTotal = Vec_WecSizeSize(pBox0->vShared);
    printf( "Box0: Matched %d entries out of %d.\n", nTotal, Vec_WecSizeSize(pBox0->vLeafLits) );
    printf( "Box1: Matched %d entries out of %d.\n", nTotal, Vec_WecSizeSize(pBox1->vLeafLits) );

    //Acec_MatchPrintEquivLits( pBox0->pGia, pBox0->vShared, Vec_IntArray(vMap0), 0 );
    //Acec_MatchPrintEquivLits( pBox1->pGia, pBox1->vShared, Vec_IntArray(vMap1), 0 );
    //printf( "\n" );

    //Acec_MatchPrintEquivLits( pBox0->pGia, pBox0->vUnique, Vec_IntArray(vMap0), 0 );
    //Acec_MatchPrintEquivLits( pBox1->pGia, pBox1->vUnique, Vec_IntArray(vMap1), 0 );

    Vec_IntFree( vMap0 );
    Vec_IntFree( vMap1 );
    return nTotal;
}